

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__psd_decode_rle(stbi__context *s,stbi_uc *p,int pixelCount)

{
  byte bVar1;
  stbi_uc sVar2;
  byte *pbVar3;
  stbi_uc *psVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  
  if (0 < pixelCount) {
    iVar9 = 0;
    iVar7 = pixelCount;
    do {
      pbVar3 = s->img_buffer;
      if (pbVar3 < s->img_buffer_end) {
LAB_00136ca0:
        s->img_buffer = pbVar3 + 1;
        bVar1 = *pbVar3;
      }
      else {
        if (s->read_from_callbacks != 0) {
          stbi__refill_buffer(s);
          pbVar3 = s->img_buffer;
          goto LAB_00136ca0;
        }
        bVar1 = 0;
      }
      if (bVar1 != 0x80) {
        uVar5 = (uint)bVar1;
        if ((char)bVar1 < '\0') {
          iVar8 = 0x101 - uVar5;
          if (iVar8 <= iVar7) {
            psVar4 = s->img_buffer;
            if (psVar4 < s->img_buffer_end) {
LAB_00136d4c:
              s->img_buffer = psVar4 + 1;
              sVar2 = *psVar4;
            }
            else {
              if (s->read_from_callbacks != 0) {
                stbi__refill_buffer(s);
                psVar4 = s->img_buffer;
                goto LAB_00136d4c;
              }
              sVar2 = '\0';
            }
            iVar6 = uVar5 - 0x101;
            do {
              *p = sVar2;
              p = p + 4;
              iVar6 = iVar6 + 1;
            } while (iVar6 != 0);
            iVar9 = iVar9 + iVar8;
          }
          if (iVar7 < iVar8) {
            return 0;
          }
        }
        else {
          if (iVar7 <= (int)uVar5) {
            return 0;
          }
          iVar7 = uVar5 + 1;
          do {
            psVar4 = s->img_buffer;
            if (psVar4 < s->img_buffer_end) {
LAB_00136cef:
              s->img_buffer = psVar4 + 1;
              sVar2 = *psVar4;
            }
            else {
              if (s->read_from_callbacks != 0) {
                stbi__refill_buffer(s);
                psVar4 = s->img_buffer;
                goto LAB_00136cef;
              }
              sVar2 = '\0';
            }
            *p = sVar2;
            p = p + 4;
            iVar7 = iVar7 + -1;
          } while (iVar7 != 0);
          iVar9 = iVar9 + uVar5 + 1;
        }
      }
      iVar7 = pixelCount - iVar9;
    } while (iVar7 != 0 && iVar9 <= pixelCount);
  }
  return 1;
}

Assistant:

static int stbi__psd_decode_rle(stbi__context *s, stbi_uc *p, int pixelCount)
{
   int count, nleft, len;

   count = 0;
   while ((nleft = pixelCount - count) > 0) {
      len = stbi__get8(s);
      if (len == 128) {
         // No-op.
      } else if (len < 128) {
         // Copy next len+1 bytes literally.
         len++;
         if (len > nleft) return 0; // corrupt data
         count += len;
         while (len) {
            *p = stbi__get8(s);
            p += 4;
            len--;
         }
      } else if (len > 128) {
         stbi_uc   val;
         // Next -len+1 bytes in the dest are replicated from next source byte.
         // (Interpret len as a negative 8-bit int.)
         len = 257 - len;
         if (len > nleft) return 0; // corrupt data
         val = stbi__get8(s);
         count += len;
         while (len) {
            *p = val;
            p += 4;
            len--;
         }
      }
   }

   return 1;
}